

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O3

bool __thiscall
BattleWithLandlord::LoadCards(BattleWithLandlord *this,string *str1,string *str2,string *last)

{
  size_type sVar1;
  pointer pcVar2;
  bool bVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  char x_1;
  char x;
  char local_42;
  char local_41;
  string *local_40;
  string *local_38;
  
  local_40 = str2;
  local_38 = last;
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::clear
            (&this->_cards[0]._M_t);
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::clear
            ((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> *)
             (this->_cards + 1));
  sVar1 = str1->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (str1->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      local_41 = pcVar2[sVar5];
      pmVar4 = std::__detail::
               _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this,&local_41);
      std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
      _M_insert_equal<char_const&>
                ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>> *)
                 this->_cards,pmVar4);
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  sVar1 = local_40->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (local_40->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      local_42 = pcVar2[sVar5];
      pmVar4 = std::__detail::
               _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this,&local_42);
      std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
      _M_insert_equal<char_const&>
                ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>> *)
                 (this->_cards + 1),pmVar4);
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  bVar3 = Str2CardStyle(this,local_38,&this->_last);
  this->_side = 0;
  this->_round = 0;
  this->_ready = true;
  return bVar3;
}

Assistant:

bool BattleWithLandlord::LoadCards(const string &str1, const string &str2, const string &last) {
    _cards[0].clear();
    _cards[1].clear();
    for (auto x: str1) {
        _cards[0].insert(_name2id[x]);
    }
    for (auto x: str2) {
        _cards[1].insert(_name2id[x]);
    }
    
    bool valid = Str2CardStyle(last, _last);

    _round = 0;
    _side = 0;
    _ready = true;
    // PrintCards();
    return valid;
}